

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::PicturedInputBufferEnd(Forth *this)

{
  uint uVar1;
  int iVar2;
  CAddr Value;
  uint uVar3;
  string local_50;
  pointer local_30;
  pointer local_28;
  
  requireDStackDepth(this,2,"#>");
  local_30 = (this->picturedInputBuffer).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_28 = (this->picturedInputBuffer).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::
  _M_construct<std::reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            ((string *)&local_50);
  iVar2 = this->vmSegmentParseBufferCounter;
  uVar1 = iVar2 + 1;
  uVar3 = iVar2 + 4;
  if (-1 < (int)uVar1) {
    uVar3 = uVar1;
  }
  this->vmSegmentParseBufferCounter = uVar1;
  Value = setVirtualMemory(this,&local_50,(iVar2 - (uVar3 & 0xfffffffc)) + 4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  ForthStack<unsigned_int>::setTop(&this->dStack,1,Value);
  ForthStack<unsigned_int>::setTop
            (&this->dStack,
             *(int *)&(this->picturedInputBuffer).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
             *(int *)&(this->picturedInputBuffer).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
  return;
}

Assistant:

void PicturedInputBufferEnd(){
			REQUIRE_DSTACK_DEPTH(2, "#>");
			auto dataInDataSpace_ = PutStringToEndOfDataSpace(std::string(picturedInputBuffer.rbegin(), picturedInputBuffer.rend()));
			dStack.setTop(1,CELL(dataInDataSpace_));
			dStack.setTop(CELL(picturedInputBuffer.size()));

		}